

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::OptionContext::insertOption
          (OptionContext *this,size_t groupId,SharedOptPtr *opt)

{
  char cVar1;
  Option *this_00;
  ulong uVar2;
  undefined8 uVar3;
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *in_RDX;
  size_type in_RSI;
  OptionContext *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_bool>
  pVar4;
  string shortName;
  char sName [2];
  key_type k;
  string *l;
  unsigned_long *in_stack_fffffffffffffea0;
  value_type *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  byte in_stack_fffffffffffffeb7;
  OptionContext *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  undefined1 local_51 [39];
  char local_2a;
  char local_29;
  size_type local_28;
  string *local_20;
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *local_18;
  size_type local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  this_00 = detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator->(in_RDX);
  local_20 = Option::name_abi_cxx11_(this_00);
  local_28 = std::
             vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
             ::size(&in_RDI->options_);
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator->(local_18);
  cVar1 = Option::alias((Option *)0x12a494);
  if (cVar1 != '\0') {
    local_2a = '-';
    detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator->(local_18);
    local_29 = Option::alias((Option *)0x12a4b9);
    in_stack_fffffffffffffef8 = (string *)local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_51 + 1),&local_2a,2,(allocator *)in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef0 = in_RDI;
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    in_RDI = in_stack_fffffffffffffef0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               &in_stack_fffffffffffffea8->first,in_stack_fffffffffffffea0);
    pVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
             *)0x12a596);
    if (((pVar4.second ^ 0xffU) & 1) != 0) {
      uVar3 = __cxa_allocate_exception(0x58);
      caption_abi_cxx11_(in_RDI);
      DuplicateOption::DuplicateOption
                ((DuplicateOption *)in_RDI,in_stack_fffffffffffffef8,
                 (string *)in_stack_fffffffffffffef0);
      __cxa_throw(uVar3,&DuplicateOption::typeinfo,DuplicateOption::~DuplicateOption);
    }
    std::__cxx11::string::~string((string *)(local_51 + 1));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<unsigned_long_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               &in_stack_fffffffffffffea8->first,in_stack_fffffffffffffea0);
    pVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb7 = pVar4.second ^ 0xff;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
             *)0x12a72a);
    if ((in_stack_fffffffffffffeb7 & 1) != 0) {
      uVar3 = __cxa_allocate_exception(0x58);
      caption_abi_cxx11_(in_RDI);
      DuplicateOption::DuplicateOption
                ((DuplicateOption *)in_RDI,in_stack_fffffffffffffef8,
                 (string *)in_stack_fffffffffffffef0);
      __cxa_throw(uVar3,&DuplicateOption::typeinfo,DuplicateOption::~DuplicateOption);
    }
  }
  std::
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  ::push_back((vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
               *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
              (value_type *)in_stack_fffffffffffffea8);
  std::
  vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
  ::operator[](&in_RDI->groups_,local_10);
  std::
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  ::push_back((vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
               *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
              (value_type *)in_stack_fffffffffffffea8);
  return;
}

Assistant:

void OptionContext::insertOption(size_t groupId, const SharedOptPtr& opt) {
	const string& l = opt->name();
	key_type k(options_.size());
	if (opt->alias()) {
		char sName[2] = {'-', opt->alias()};
		std::string shortName(sName, 2);
		if (!index_.insert(Name2Key::value_type(shortName, k)).second) {
			throw DuplicateOption(caption(), l);
		}
	}
	if (!l.empty()) {
		if (!index_.insert(Name2Key::value_type(l, k)).second) {
			throw DuplicateOption(caption(), l);
		}
	}
	options_.push_back(opt);
	groups_[groupId].options_.push_back(opt);
}